

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

fdb_status fdb_kvs_rollback(fdb_kvs_handle **handle_ptr,fdb_seqnum_t seqnum)

{
  __int_type_conflict1 _Var1;
  byte bVar2;
  fdb_kvs_handle *pfVar3;
  fdb_file_handle *pfVar4;
  fdb_kvs_id_t fVar5;
  hbtrie *phVar6;
  btreeblk_handle *pbVar7;
  filemgr *pfVar8;
  kvs_info *__ptr;
  long lVar9;
  fdb_log_callback_ex p_Var10;
  bid_t bVar11;
  char *rawkey;
  fdb_kvs_handle *handle;
  bool bVar12;
  fdb_status status;
  hbtrie_result hVar13;
  int rawkeylen;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char *buf;
  fdb_kvs_handle *pfVar20;
  undefined8 uStack_1a0;
  char *pcStack_190;
  char acStack_188 [8];
  undefined1 local_180 [8];
  fdb_config config;
  fdb_kvs_config kvs_config;
  undefined1 local_68 [4];
  uint sleep_time;
  bid_t id_root;
  bid_t seq_root;
  bid_t dummy;
  char *local_48;
  fdb_kvs_handle *local_40;
  fdb_file_handle *local_38;
  
  buf = acStack_188;
  status = FDB_RESULT_INVALID_HANDLE;
  if ((handle_ptr != (fdb_kvs_handle **)0x0) &&
     (pfVar3 = *handle_ptr, pfVar3 != (fdb_kvs_handle *)0x0)) {
    if (pfVar3->kvs == (kvs_info *)0x0) {
      status = FDB_RESULT_INVALID_ARGS;
    }
    else {
      pfVar20 = pfVar3->kvs->root;
      pfVar4 = pfVar3->fhandle;
      pcStack_190 = (char *)0x135bf5;
      memcpy(local_180,&pfVar3->config,0xf8);
      kvs_config.custom_cmp = (fdb_custom_cmp_variable)(pfVar3->kvs_config).custom_cmp_param;
      config.num_blocks_readahead = *(uint32_t *)&pfVar3->kvs_config;
      config.bottom_up_index_build = (bool)(pfVar3->kvs_config).field_0x4;
      config._245_3_ = *(undefined3 *)&(pfVar3->kvs_config).field_0x5;
      kvs_config._0_4_ = *(undefined4 *)&(pfVar3->kvs_config).custom_cmp;
      kvs_config._4_4_ = *(undefined4 *)((long)&(pfVar3->kvs_config).custom_cmp + 4);
      if (((pfVar3->config).flags & 2) == 0) {
        pcStack_190 = (char *)0x135c16;
        filemgr_mutex_lock(pfVar3->file);
        pcStack_190 = (char *)0x135c24;
        filemgr_set_rollback(pfVar3->file,'\x01');
        pcStack_190 = (char *)0x135c2d;
        bVar12 = wal_txn_exists(pfVar3->file);
        if (bVar12) {
          pcStack_190 = (char *)0x135c3c;
          filemgr_set_rollback(pfVar3->file,'\0');
          pcStack_190 = (char *)0x135c45;
          filemgr_mutex_unlock(pfVar3->file);
          status = FDB_RESULT_FAIL_BY_TRANSACTION;
        }
        else {
          kvs_config.custom_cmp_param._4_4_ = 10000;
          dummy = (bid_t)pfVar20;
          local_38 = pfVar4;
          while( true ) {
            _Var1 = (pfVar3->file->status).super___atomic_base<unsigned_char>._M_i;
            pcStack_190 = (char *)0x135cce;
            filemgr_mutex_unlock(pfVar3->file);
            if (_Var1 != '\x01') break;
            pcStack_190 = (char *)0x135ce1;
            decaying_usleep((uint *)((long)&kvs_config.custom_cmp_param + 4),1000000);
            pcStack_190 = (char *)0x135cea;
            filemgr_mutex_lock(pfVar3->file);
          }
          if (_Var1 == '\x04') {
            pcStack_190 = (char *)0x135cff;
            fdb_check_file_reopen(pfVar3,(file_status_t *)0x0);
          }
          pcStack_190 = (char *)0x135d07;
          fdb_sync_db_header(pfVar3);
          pfVar4 = local_38;
          bVar11 = dummy;
          if (pfVar3->seqnum < seqnum) {
            pcStack_190 = (char *)0x135d24;
            filemgr_set_rollback(*(filemgr **)(dummy + 0x48),'\0');
            status = FDB_RESULT_NO_DB_INSTANCE;
          }
          else {
            pcStack_190 = (char *)0x135d3b;
            local_48 = _fdb_kvs_get_name(pfVar3,pfVar3->file);
            if (seqnum == 0) {
              pcStack_190 = (char *)0x135dd6;
              status = _fdb_kvs_remove(pfVar4,local_48,true);
              pcStack_190 = (char *)0x135de5;
              filemgr_set_rollback(*(filemgr **)(bVar11 + 0x48),'\0');
            }
            else {
              pcStack_190 = (char *)0x135d57;
              local_40 = (fdb_kvs_handle *)calloc(1,0x208);
              if (local_40 == (fdb_kvs_handle *)0x0) {
                pcStack_190 = (char *)0x135df5;
                filemgr_set_rollback(pfVar3->file,'\0');
                status = FDB_RESULT_ALLOC_FAIL;
              }
              else {
                local_40->max_seqnum = seqnum;
                p_Var10 = (pfVar3->log_callback).callback_ex;
                (local_40->log_callback).callback = (pfVar3->log_callback).callback;
                (local_40->log_callback).callback_ex = p_Var10;
                (local_40->log_callback).ctx_data = (pfVar3->log_callback).ctx_data;
                local_40->fhandle = pfVar4;
                LOCK();
                (local_40->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
                UNLOCK();
                if (pfVar3->kvs->type == '\x01') {
                  uStack_1a0 = 0x135dc0;
                  status = _fdb_kvs_open(pfVar3->kvs->root,(fdb_config *)local_180,
                                         (fdb_kvs_config *)&config.num_blocks_readahead,pfVar3->file
                                         ,pfVar3->file->filename,local_48,local_40);
                }
                else {
                  pcStack_190 = (char *)0x135e1b;
                  status = _fdb_open(local_40,pfVar3->file->filename,FDB_AFILENAME,
                                     (fdb_config *)local_180);
                }
                pcStack_190 = (char *)0x135e29;
                filemgr_set_rollback(pfVar3->file,'\0');
                if (status == FDB_RESULT_SUCCESS) {
                  bVar2 = local_40->trie->chunksize;
                  pcStack_190 = (char *)0x135e47;
                  filemgr_mutex_lock(pfVar3->file);
                  pfVar20 = local_40;
                  lVar9 = -(ulong)(bVar2 + 0xf & 0xfffffff0);
                  buf = acStack_188 + lVar9;
                  fVar5 = local_40->kvs->id;
                  pcVar14 = acStack_188 + lVar9 + -8;
                  local_38 = (fdb_file_handle *)(ulong)bVar2;
                  builtin_strncpy(acStack_188 + lVar9 + -8,"r^\x13",4);
                  pcVar14[4] = '\0';
                  pcVar14[5] = '\0';
                  pcVar14[6] = '\0';
                  pcVar14[7] = '\0';
                  kvid2buf((ulong)bVar2,fVar5,buf);
                  pfVar4 = local_38;
                  phVar6 = pfVar20->trie;
                  pcVar15 = acStack_188 + lVar9 + -8;
                  local_48 = buf;
                  pcVar15[0] = -0x76;
                  pcVar15[1] = '^';
                  pcVar15[2] = '\x13';
                  pcVar15[3] = '\0';
                  pcVar15[4] = '\0';
                  pcVar15[5] = '\0';
                  pcVar15[6] = '\0';
                  pcVar15[7] = '\0';
                  hVar13 = hbtrie_find_partial(phVar6,buf,(int)pfVar4,local_68);
                  pbVar7 = pfVar20->bhandle;
                  pcVar16 = acStack_188 + lVar9 + -8;
                  pcVar16[0] = -0x6a;
                  pcVar16[1] = '^';
                  pcVar16[2] = '\x13';
                  pcVar16[3] = '\0';
                  pcVar16[4] = '\0';
                  pcVar16[5] = '\0';
                  pcVar16[6] = '\0';
                  pcVar16[7] = '\0';
                  btreeblk_end(pbVar7);
                  rawkey = local_48;
                  phVar6 = *(hbtrie **)(dummy + 0x30);
                  rawkeylen = (int)local_38;
                  if (hVar13 == HBTRIE_RESULT_SUCCESS) {
                    pcVar18 = acStack_188 + lVar9 + -8;
                    pcVar18[0] = -0x39;
                    pcVar18[1] = '^';
                    pcVar18[2] = '\x13';
                    pcVar18[3] = '\0';
                    pcVar18[4] = '\0';
                    pcVar18[5] = '\0';
                    pcVar18[6] = '\0';
                    pcVar18[7] = '\0';
                    hbtrie_insert_partial(phVar6,rawkey,rawkeylen,local_68,&seq_root);
                  }
                  else {
                    pcVar17 = acStack_188 + lVar9 + -8;
                    pcVar17[0] = -0x50;
                    pcVar17[1] = '^';
                    pcVar17[2] = '\x13';
                    pcVar17[3] = '\0';
                    pcVar17[4] = '\0';
                    pcVar17[5] = '\0';
                    pcVar17[6] = '\0';
                    pcVar17[7] = '\0';
                    hbtrie_remove_partial(phVar6,rawkey,rawkeylen);
                  }
                  pfVar20 = (fdb_kvs_handle *)dummy;
                  pbVar7 = *(btreeblk_handle **)(dummy + 0x58);
                  pcVar19 = acStack_188 + lVar9 + -8;
                  pcVar19[0] = -0x2b;
                  pcVar19[1] = '^';
                  pcVar19[2] = '\x13';
                  pcVar19[3] = '\0';
                  pcVar19[4] = '\0';
                  pcVar19[5] = '\0';
                  pcVar19[6] = '\0';
                  pcVar19[7] = '\0';
                  btreeblk_end(pbVar7);
                  if (config.wal_flush_before_commit == true) {
                    buf = &stack0xfffffffffffffe68 + lVar9;
                    fVar5 = local_40->kvs->id;
                    *(undefined8 *)((long)&uStack_1a0 + lVar9) = 0x135f08;
                    kvid2buf(8,fVar5,buf);
                    phVar6 = (local_40->field_6).seqtrie;
                    *(undefined8 *)((long)&uStack_1a0 + lVar9) = 0x135f21;
                    hVar13 = hbtrie_find_partial(phVar6,buf,8,&id_root);
                    local_38 = (fdb_file_handle *)CONCAT44(local_38._4_4_,hVar13);
                    pbVar7 = local_40->bhandle;
                    *(undefined8 *)((long)&uStack_1a0 + lVar9) = 0x135f31;
                    btreeblk_end(pbVar7);
                    phVar6 = *(hbtrie **)((long)pfVar20 + 0x40);
                    if ((int)local_38 == 0) {
                      *(undefined8 *)((long)&uStack_1a0 + lVar9) = 0x135f60;
                      hbtrie_insert_partial(phVar6,buf,8,&id_root,&seq_root);
                    }
                    else {
                      *(undefined8 *)((long)&uStack_1a0 + lVar9) = 0x135f49;
                      hbtrie_remove_partial(phVar6,buf,8);
                    }
                    pfVar20 = (fdb_kvs_handle *)dummy;
                    pbVar7 = *(btreeblk_handle **)(dummy + 0x58);
                    *(undefined8 *)((long)&uStack_1a0 + lVar9) = 0x135f6e;
                    btreeblk_end(pbVar7);
                  }
                  handle = local_40;
                  pfVar8 = pfVar3->file;
                  fVar5 = pfVar3->kvs->id;
                  buf[-8] = -0x7d;
                  buf[-7] = '_';
                  buf[-6] = '\x13';
                  buf[-5] = '\0';
                  buf[-4] = '\0';
                  buf[-3] = '\0';
                  buf[-2] = '\0';
                  buf[-1] = '\0';
                  local_38 = (fdb_file_handle *)fdb_kvs_get_seqnum(pfVar8,fVar5);
                  pfVar8 = pfVar3->file;
                  fVar5 = pfVar3->kvs->id;
                  buf[-8] = -0x65;
                  buf[-7] = '_';
                  buf[-6] = '\x13';
                  buf[-5] = '\0';
                  buf[-4] = '\0';
                  buf[-3] = '\0';
                  buf[-2] = '\0';
                  buf[-1] = '\0';
                  fdb_kvs_set_seqnum(pfVar8,fVar5,seqnum);
                  pfVar3->seqnum = seqnum;
                  pfVar8 = pfVar3->file;
                  buf[-8] = -0x55;
                  buf[-7] = '_';
                  buf[-6] = '\x13';
                  buf[-5] = '\0';
                  buf[-4] = '\0';
                  buf[-3] = '\0';
                  buf[-2] = '\0';
                  buf[-1] = '\0';
                  filemgr_mutex_unlock(pfVar8);
                  pfVar20->rollback_revnum = handle->rollback_revnum;
                  bVar2 = (pfVar3->config).durability_opt;
                  buf[-8] = -0x2d;
                  buf[-7] = '_';
                  buf[-6] = '\x13';
                  buf[-5] = '\0';
                  buf[-4] = '\0';
                  buf[-3] = '\0';
                  buf[-2] = '\0';
                  buf[-1] = '\0';
                  status = _fdb_commit(pfVar20,'\x01',(bVar2 & 2) == 0);
                  if (status == FDB_RESULT_SUCCESS) {
                    builtin_strncpy(buf + -8,"O`\x13",4);
                    buf[-4] = '\0';
                    buf[-3] = '\0';
                    buf[-2] = '\0';
                    buf[-1] = '\0';
                    _fdb_kvs_close(handle);
                    *handle_ptr = pfVar3;
                  }
                  else {
                    *(fdb_seqnum_t *)(buf + -8) = seqnum;
                    *(char **)(buf + -0x10) =
                         "Rollback failed due to a commit failure with a sequence number %lu";
                    buf[-0x18] = '\x12';
                    buf[-0x17] = '`';
                    buf[-0x16] = '\x13';
                    buf[-0x15] = '\0';
                    buf[-0x14] = '\0';
                    buf[-0x13] = '\0';
                    buf[-0x12] = '\0';
                    buf[-0x11] = '\0';
                    fdb_log_impl(&pfVar3->log_callback,2,status,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                                 ,"fdb_kvs_rollback",0x921,*(char **)(buf + -0x10));
                    pfVar8 = pfVar3->file;
                    buf[-8] = '\x1f';
                    buf[-7] = '`';
                    buf[-6] = '\x13';
                    buf[-5] = '\0';
                    buf[-4] = '\0';
                    buf[-3] = '\0';
                    buf[-2] = '\0';
                    buf[-1] = '\0';
                    filemgr_mutex_lock(pfVar8);
                    pfVar4 = local_38;
                    pfVar8 = pfVar3->file;
                    fVar5 = pfVar3->kvs->id;
                    buf[-8] = '4';
                    buf[-7] = '`';
                    buf[-6] = '\x13';
                    buf[-5] = '\0';
                    buf[-4] = '\0';
                    buf[-3] = '\0';
                    buf[-2] = '\0';
                    buf[-1] = '\0';
                    fdb_kvs_set_seqnum(pfVar8,fVar5,(fdb_seqnum_t)pfVar4);
                    pfVar8 = pfVar3->file;
                    buf[-8] = '=';
                    buf[-7] = '`';
                    buf[-6] = '\x13';
                    buf[-5] = '\0';
                    buf[-4] = '\0';
                    buf[-3] = '\0';
                    buf[-2] = '\0';
                    buf[-1] = '\0';
                    filemgr_mutex_unlock(pfVar8);
                    buf[-8] = 'E';
                    buf[-7] = '`';
                    buf[-6] = '\x13';
                    buf[-5] = '\0';
                    buf[-4] = '\0';
                    buf[-3] = '\0';
                    buf[-2] = '\0';
                    buf[-1] = '\0';
                    _fdb_kvs_close(handle);
                  }
                  __ptr = handle->kvs;
                  if (__ptr != (kvs_info *)0x0) {
                    builtin_strncpy(buf + -8,"a`\x13",4);
                    buf[-4] = '\0';
                    buf[-3] = '\0';
                    buf[-2] = '\0';
                    buf[-1] = '\0';
                    free(__ptr);
                  }
                }
                pfVar3 = local_40;
                *(undefined8 *)(buf + -8) = 0x13606a;
                free(pfVar3);
              }
            }
          }
        }
      }
      else {
        pcStack_190 = pfVar3->file->filename;
        uStack_1a0 = 0x135ca4;
        status = fdb_log_impl(&pfVar3->log_callback,2,FDB_RESULT_RONLY_VIOLATION,
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                              ,"fdb_kvs_rollback",0x895,
                              "Warning: Rollback is not allowed on the read-only DB file \'%s\'.");
      }
    }
  }
  return status;
}

Assistant:

fdb_status fdb_kvs_rollback(fdb_kvs_handle **handle_ptr, fdb_seqnum_t seqnum)
{
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_handle *handle_in, *handle, *super_handle;
    fdb_status fs;
    fdb_seqnum_t old_seqnum;
    fdb_file_handle *fhandle;
    char *kvs_name;

    if (!handle_ptr) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    handle_in = *handle_ptr;

    if (!handle_in) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!handle_in->kvs) {
        return FDB_RESULT_INVALID_ARGS;
    }
    super_handle = handle_in->kvs->root;
    fhandle = handle_in->fhandle;
    config = handle_in->config;
    kvs_config = handle_in->kvs_config;

    if (handle_in->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&handle_in->log_callback, FDB_LOG_ERROR,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: Rollback is not allowed on "
                       "the read-only DB file '%s'.",
                       handle_in->file->filename);
    }

    filemgr_mutex_lock(handle_in->file);
    filemgr_set_rollback(handle_in->file, 1); // disallow writes operations
    // All transactions should be closed before rollback
    if (wal_txn_exists(handle_in->file)) {
        filemgr_set_rollback(handle_in->file, 0);
        filemgr_mutex_unlock(handle_in->file);
        return FDB_RESULT_FAIL_BY_TRANSACTION;
    }

    // If compaction is running, wait until it is aborted.
    // TODO: Find a better way of waiting for the compaction abortion.
    unsigned int sleep_time = 10000; // 10 ms.
    file_status_t fstatus = filemgr_get_file_status(handle_in->file);
    while (fstatus == FILE_COMPACT_OLD) {
        filemgr_mutex_unlock(handle_in->file);
        decaying_usleep(&sleep_time, 1000000);
        filemgr_mutex_lock(handle_in->file);
        fstatus = filemgr_get_file_status(handle_in->file);
    }
    if (fstatus == FILE_REMOVED_PENDING) {
        filemgr_mutex_unlock(handle_in->file);
        fdb_check_file_reopen(handle_in, NULL);
    } else {
        filemgr_mutex_unlock(handle_in->file);
    }

    fdb_sync_db_header(handle_in);

    // if the max sequence number seen by this handle is lower than the
    // requested snapshot marker, it means the snapshot is not yet visible
    // even via the current fdb_kvs_handle
    if (seqnum > handle_in->seqnum) {
        filemgr_set_rollback(super_handle->file, 0); // allow mutations
        return FDB_RESULT_NO_DB_INSTANCE;
    }

    kvs_name = _fdb_kvs_get_name(handle_in, handle_in->file);
    if (seqnum == 0) { // Handle special case of rollback to zero..
        fs = _fdb_kvs_remove(fhandle, kvs_name, true /*recreate!*/);
        filemgr_set_rollback(super_handle->file, 0); // allow mutations
        return fs;
    }

    handle = (fdb_kvs_handle *) calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        filemgr_set_rollback(handle_in->file, 0); // allow mutations
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    handle->max_seqnum = seqnum;
    handle->log_callback = handle_in->log_callback;
    handle->fhandle = fhandle;
    atomic_init_uint8_t(&handle->handle_busy, 0);

    if (handle_in->kvs->type == KVS_SUB) {
        fs = _fdb_kvs_open(handle_in->kvs->root,
                           &config,
                           &kvs_config,
                           handle_in->file,
                           handle_in->file->filename,
                           kvs_name,
                           handle);
    } else {
        fs = _fdb_open(handle, handle_in->file->filename,
                       FDB_AFILENAME, &config);
    }
    filemgr_set_rollback(handle_in->file, 0); // allow mutations

    if (fs == FDB_RESULT_SUCCESS) {
        // get KV instance's sub B+trees' root node BIDs
        // from both ID-tree and Seq-tree, AND
        // replace current handle's sub B+trees' root node BIDs
        // by old BIDs
        size_t size_chunk, size_id;
        bid_t id_root, seq_root, dummy;
        uint8_t *_kv_id;
        hbtrie_result hr;

        size_chunk = handle->trie->chunksize;
        size_id = sizeof(fdb_kvs_id_t);

        filemgr_mutex_lock(handle_in->file);

        // read root BID of the KV instance from the old handle
        // and overwrite into the current handle
        _kv_id = alca(uint8_t, size_chunk);
        kvid2buf(size_chunk, handle->kvs->id, _kv_id);
        hr = hbtrie_find_partial(handle->trie, _kv_id,
                                 size_chunk, &id_root);
        btreeblk_end(handle->bhandle);
        if (hr == HBTRIE_RESULT_SUCCESS) {
            hbtrie_insert_partial(super_handle->trie,
                                  _kv_id, size_chunk,
                                  &id_root, &dummy);
        } else { // No Trie info in rollback header.
                 // Erase kv store from super handle's main index.
            hbtrie_remove_partial(super_handle->trie, _kv_id, size_chunk);
        }
        btreeblk_end(super_handle->bhandle);

        if (config.seqtree_opt == FDB_SEQTREE_USE) {
            // same as above for seq-trie
            _kv_id = alca(uint8_t, size_id);
            kvid2buf(size_id, handle->kvs->id, _kv_id);
            hr = hbtrie_find_partial(handle->seqtrie, _kv_id,
                                     size_id, &seq_root);
            btreeblk_end(handle->bhandle);
            if (hr == HBTRIE_RESULT_SUCCESS) {
                hbtrie_insert_partial(super_handle->seqtrie,
                                      _kv_id, size_id,
                                      &seq_root, &dummy);
            } else { // No seqtrie info in rollback header.
                     // Erase kv store from super handle's seqtrie index.
                hbtrie_remove_partial(super_handle->seqtrie, _kv_id, size_id);
            }
            btreeblk_end(super_handle->bhandle);
        }

        old_seqnum = fdb_kvs_get_seqnum(handle_in->file,
                                        handle_in->kvs->id);
        fdb_kvs_set_seqnum(handle_in->file,
                           handle_in->kvs->id, seqnum);
        handle_in->seqnum = seqnum;
        filemgr_mutex_unlock(handle_in->file);

        super_handle->rollback_revnum = handle->rollback_revnum;
        fs = _fdb_commit(super_handle, FDB_COMMIT_MANUAL_WAL_FLUSH,
                         !(handle_in->config.durability_opt & FDB_DRB_ASYNC));
        if (fs == FDB_RESULT_SUCCESS) {
            _fdb_kvs_close(handle);
            *handle_ptr = handle_in;
            fdb_kvs_info_free(handle);
            free(handle);
        } else {
            // cancel the rolling-back of the sequence number
            fdb_log(&handle_in->log_callback, FDB_LOG_ERROR, fs,
                    "Rollback failed due to a commit failure with a sequence "
                    "number %" _F64, seqnum);
            filemgr_mutex_lock(handle_in->file);
            fdb_kvs_set_seqnum(handle_in->file,
                               handle_in->kvs->id, old_seqnum);
            filemgr_mutex_unlock(handle_in->file);
            _fdb_kvs_close(handle);
            fdb_kvs_info_free(handle);
            free(handle);
        }
    } else {
        free(handle);
    }

    return fs;
}